

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esa.hxx
# Opt level: O1

long esaxx_private::
     suffixtree<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> L,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> R,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> D,long n)

{
  iterator iVar1;
  long lVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var3
  ;
  long lVar4;
  long lVar5;
  long i;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> S;
  pair<long,_long> cur;
  void *local_88;
  iterator iStack_80;
  pair<long,_long> *local_78;
  pair<long,_long> local_68;
  long local_50;
  long *local_48;
  pair<long,_long> local_40;
  
  if (n == 0) {
    lVar2 = 0;
  }
  else {
    L._M_current[*SA._M_current] = SA._M_current[n + -1];
    if (1 < n) {
      lVar2 = 1;
      do {
        L._M_current[SA._M_current[lVar2]] = SA._M_current[lVar2 + -1];
        lVar2 = lVar2 + 1;
      } while (n != lVar2);
    }
    if (0 < n) {
      lVar2 = 0;
      lVar4 = 0;
      _Var3._M_current = T._M_current;
      do {
        if (lVar4 + lVar2 < n) {
          do {
            if ((n <= L._M_current[lVar2] + lVar4) ||
               (_Var3._M_current[lVar4] != T._M_current[L._M_current[lVar2] + lVar4])) break;
            lVar5 = lVar2 + lVar4;
            lVar4 = lVar4 + 1;
          } while (lVar5 + 1 < n);
        }
        R._M_current[lVar2] = lVar4;
        lVar4 = lVar4 - (ulong)(0 < lVar4);
        lVar2 = lVar2 + 1;
        _Var3._M_current = _Var3._M_current + 1;
      } while (lVar2 != n);
    }
    if (0 < n) {
      lVar2 = 0;
      do {
        L._M_current[lVar2] = R._M_current[SA._M_current[lVar2]];
        lVar2 = lVar2 + 1;
      } while (n != lVar2);
    }
    *L._M_current = -1;
    local_88 = (void *)0x0;
    iStack_80._M_current = (pair<long,_long> *)0x0;
    local_78 = (pair<long,_long> *)0x0;
    local_68.first = -1;
    local_68.second = -1;
    local_48 = SA._M_current;
    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
    _M_realloc_insert<std::pair<long,long>>
              ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_88,
               (iterator)0x0,&local_68);
    local_50 = n + 1;
    lVar4 = 0;
    lVar2 = 0;
    while( true ) {
      local_68.second = -1;
      if (lVar4 != n) {
        local_68.second = L._M_current[lVar4];
      }
      lVar5 = iStack_80._M_current[-1].second;
      local_68.first = lVar4;
      if (local_68.second < lVar5) {
        iVar1._M_current = iStack_80._M_current;
        do {
          iStack_80._M_current = iVar1._M_current + -1;
          local_68.first = (iStack_80._M_current)->first;
          if (local_68.first < lVar4 + -1) {
            L._M_current[lVar2] = local_68.first;
            R._M_current[lVar2] = lVar4;
            D._M_current[lVar2] = lVar5;
            lVar2 = lVar2 + 1;
          }
          lVar5 = iVar1._M_current[-2].second;
          iVar1._M_current = iStack_80._M_current;
        } while (local_68.second < lVar5);
      }
      if (lVar5 < local_68.second) {
        if (iStack_80._M_current == local_78) {
          std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
          _M_realloc_insert<std::pair<long,long>const&>
                    ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_88,
                     iStack_80,&local_68);
        }
        else {
          (iStack_80._M_current)->first = local_68.first;
          (iStack_80._M_current)->second = local_68.second;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      if (lVar4 == n) break;
      local_40.second = local_50 - local_48[lVar4];
      local_40.first = lVar4;
      if (iStack_80._M_current == local_78) {
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        _M_realloc_insert<std::pair<long,long>>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)&local_88,
                   iStack_80,&local_40);
      }
      else {
        (iStack_80._M_current)->first = lVar4;
        (iStack_80._M_current)->second = local_40.second;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      lVar4 = lVar4 + 1;
    }
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return lVar2;
}

Assistant:

index_type suffixtree(string_type T, sarray_type SA, sarray_type L, sarray_type R, sarray_type D, index_type n){
  if (n == 0){
    return 0;
  }
  sarray_type Psi = L;
  Psi[SA[0]] = SA[n-1];
  for (index_type i = 1; i < n; ++i){
    Psi[SA[i]] = SA[i-1];
  }

  // Compare at most 2n log n charcters. Practically fastest
  // "Permuted Longest-Common-Prefix Array", Juha Karkkainen, CPM 09
  sarray_type PLCP = R;
  index_type h = 0;
  for (index_type i = 0; i < n; ++i){
    index_type j = Psi[i];
    while (i+h < n && j+h < n && 
	   T[i+h] == T[j+h]){
      ++h;
    }
    PLCP[i] = h;
    if (h > 0) --h;
  }

  sarray_type H = L;
  for (index_type i = 0; i < n; ++i){
    H[i] = PLCP[SA[i]];
  }
  H[0] = -1;

  std::vector<std::pair<index_type, index_type> > S;
  S.push_back(std::make_pair((index_type)-1, (index_type)-1));
  size_t nodeNum = 0;
  for (index_type i = 0; ; ++i){
    std::pair<index_type, index_type> cur (i, (i == n) ? -1 : H[i]);
    std::pair<index_type, index_type> cand(S.back());
    while (cand.second > cur.second){
      if (i - cand.first > 1){
	L[nodeNum] = cand.first;
	R[nodeNum] = i;
	D[nodeNum] = cand.second;
	++nodeNum;
      }
      cur.first = cand.first;
      S.pop_back();
      cand = S.back();
    }
    if (cand.second < cur.second){
      S.push_back(cur);
    }
    if (i == n) break;
    S.push_back(std::make_pair(i, n - SA[i] + 1));
  }
  return nodeNum;
}